

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

MidiEvent * __thiscall
smf::MidiFile::addMetaEvent(MidiFile *this,int aTrack,int aTick,int aType,string *metaData)

{
  ulong uVar1;
  MidiEvent *pMVar2;
  uint uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (uint)metaData->_M_string_length;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    uVar1 = 0;
    do {
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] = (metaData->_M_dataplus)._M_p[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar1);
  }
  pMVar2 = addMetaEvent(this,aTrack,aTick,aType,&local_48);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pMVar2;
}

Assistant:

MidiEvent* MidiFile::addMetaEvent(int aTrack, int aTick, int aType,
		const std::string& metaData) {
	int length = (int)metaData.size();
	std::vector<uchar> buffer;
	buffer.resize(length);
	int i;
	for (i=0; i<length; i++) {
		buffer[i] = (uchar)metaData[i];
	}
	return addMetaEvent(aTrack, aTick, aType, buffer);
}